

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

shared_ptr<mocker::ir::IRInst> __thiscall
mocker::replaceTerminatorLabel
          (mocker *this,shared_ptr<mocker::ir::IRInst> *inst,size_t oldLabel,size_t newLabel)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  size_t sVar5;
  size_t sVar6;
  shared_ptr<mocker::ir::Addr> *psVar7;
  shared_ptr<mocker::ir::Label> *__args_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  shared_ptr<mocker::ir::IRInst> sVar9;
  shared_ptr<mocker::ir::Label> local_c0;
  shared_ptr<mocker::ir::Addr> local_b0;
  shared_ptr<mocker::ir::Label> local_a0;
  shared_ptr<mocker::ir::Addr> local_90;
  undefined1 local_80 [8];
  shared_ptr<mocker::ir::Branch> p_1;
  shared_ptr<mocker::ir::Label> local_68;
  shared_ptr<mocker::ir::Jump> local_58 [2];
  undefined1 local_38 [8];
  shared_ptr<mocker::ir::Jump> p;
  size_t newLabel_local;
  size_t oldLabel_local;
  shared_ptr<mocker::ir::IRInst> *inst_local;
  
  p.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)newLabel;
  ir::dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)local_38,inst);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
    p_Var3 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             ir::Jump::getLabel(this_00);
    peVar4 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var3);
    sVar5 = ir::Label::getID(peVar4);
    if (sVar5 != oldLabel) {
      __assert_fail("p->getLabel()->getID() == oldLabel",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                    ,0x5a,
                    "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                   );
    }
    std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_68);
    std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
              ((shared_ptr<mocker::ir::Label> *)local_58);
    std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>
              ((shared_ptr<mocker::ir::IRInst> *)this,local_58);
    std::shared_ptr<mocker::ir::Jump>::~shared_ptr(local_58);
    std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_68);
    p_1.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         1;
  }
  else {
    p_1.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         0;
  }
  std::shared_ptr<mocker::ir::Jump>::~shared_ptr((shared_ptr<mocker::ir::Jump> *)local_38);
  _Var8._M_pi = extraout_RDX;
  if (p_1.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      == 0) {
    ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)local_80,inst);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
      p_Var3 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               ir::Branch::getThen(peVar2);
      peVar4 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var3);
      sVar5 = ir::Label::getID(peVar4);
      peVar2 = std::
               __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
      p_Var3 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               ir::Branch::getElse(peVar2);
      peVar4 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var3);
      sVar6 = ir::Label::getID(peVar4);
      if (sVar5 == sVar6) {
        __assert_fail("p->getThen()->getID() != p->getElse()->getID()",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                      ,0x5e,
                      "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                     );
      }
      peVar2 = std::
               __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
      p_Var3 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               ir::Branch::getThen(peVar2);
      peVar4 = std::__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var3);
      sVar5 = ir::Label::getID(peVar4);
      if (sVar5 == oldLabel) {
        peVar2 = std::
                 __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        psVar7 = ir::Branch::getCondition(peVar2);
        std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_a0);
        peVar2 = std::
                 __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        ir::Branch::getElse(peVar2);
        std::
        make_shared<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>const&>
                  (&local_90,(shared_ptr<mocker::ir::Label> *)psVar7,&local_a0);
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Branch,void>
                  ((shared_ptr<mocker::ir::IRInst> *)this,
                   (shared_ptr<mocker::ir::Branch> *)&local_90);
        std::shared_ptr<mocker::ir::Branch>::~shared_ptr
                  ((shared_ptr<mocker::ir::Branch> *)&local_90);
        std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_a0);
        p_1.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = 1;
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        p_Var3 = (__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )ir::Branch::getElse(peVar2);
        peVar4 = std::
                 __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        sVar5 = ir::Label::getID(peVar4);
        if (sVar5 != oldLabel) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                        ,0x67,
                        "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                       );
        }
        peVar2 = std::
                 __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        psVar7 = ir::Branch::getCondition(peVar2);
        peVar2 = std::
                 __shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        __args_2 = ir::Branch::getThen(peVar2);
        std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_c0);
        std::
        make_shared<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>const&,std::shared_ptr<mocker::ir::Label>>
                  (&local_b0,(shared_ptr<mocker::ir::Label> *)psVar7,__args_2);
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Branch,void>
                  ((shared_ptr<mocker::ir::IRInst> *)this,
                   (shared_ptr<mocker::ir::Branch> *)&local_b0);
        std::shared_ptr<mocker::ir::Branch>::~shared_ptr
                  ((shared_ptr<mocker::ir::Branch> *)&local_b0);
        std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_c0);
        p_1.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = 1;
      }
    }
    else {
      p_1.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = 0;
    }
    std::shared_ptr<mocker::ir::Branch>::~shared_ptr((shared_ptr<mocker::ir::Branch> *)local_80);
    _Var8._M_pi = extraout_RDX_00;
    if (p_1.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                    ,0x69,
                    "std::shared_ptr<ir::IRInst> mocker::replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &, std::size_t, std::size_t)"
                   );
    }
  }
  sVar9.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar9.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::IRInst>)
         sVar9.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ir::IRInst>
replaceTerminatorLabel(const std::shared_ptr<ir::IRInst> &inst,
                       std::size_t oldLabel, std::size_t newLabel) {
  if (auto p = ir::dyc<ir::Jump>(inst)) {
    assert(p->getLabel()->getID() == oldLabel);
    return std::make_shared<ir::Jump>(std::make_shared<ir::Label>(newLabel));
  }
  if (auto p = ir::dyc<ir::Branch>(inst)) {
    assert(p->getThen()->getID() != p->getElse()->getID());
    if (p->getThen()->getID() == oldLabel)
      return std::make_shared<ir::Branch>(p->getCondition(),
                                          std::make_shared<ir::Label>(newLabel),
                                          p->getElse());
    if (p->getElse()->getID() == oldLabel)
      return std::make_shared<ir::Branch>(
          p->getCondition(), p->getThen(),
          std::make_shared<ir::Label>(newLabel));
    assert(false);
  }
  assert(false);
}